

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O0

btSoftBody *
btSoftBodyHelpers::CreatePatch
          (btSoftBodyWorldInfo *worldInfo,btVector3 *corner00,btVector3 *corner10,
          btVector3 *corner01,btVector3 *corner11,int resx,int resy,int fixeds,bool gendiags)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  btScalar *pbVar4;
  long lVar5;
  ulong uVar6;
  btSoftBody *pbVar7;
  btScalar in_R9D;
  btVector3 bVar8;
  btScalar in_stack_00000008;
  uint in_stack_00000010;
  byte in_stack_00000018;
  bool mdy;
  bool mdx;
  int idx;
  int ix_1;
  btSoftBody *psb;
  btScalar tx;
  int ix;
  btVector3 py1;
  btVector3 py0;
  btScalar ty;
  int iy;
  btScalar *m;
  btVector3 *x;
  int tot;
  int ry;
  int rx;
  btSoftBody *in_stack_00000100;
  btVector3 *in_stack_fffffffffffffef8;
  btVector3 *in_stack_ffffffffffffff00;
  btSoftBody *pbVar9;
  btSoftBody *in_stack_ffffffffffffff10;
  int node2;
  btSoftBody *in_stack_ffffffffffffff18;
  int node0;
  btSoftBody *in_stack_ffffffffffffff20;
  btSoftBody *local_d8;
  int local_b4;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  float local_70;
  int local_6c;
  void *local_68;
  btSoftBody *local_50;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  byte local_35;
  btSoftBody *local_8;
  
  local_35 = in_stack_00000018 & 1;
  if (((int)in_R9D < 2) || ((int)in_stack_00000008 < 2)) {
    local_8 = (btSoftBody *)0x0;
  }
  else {
    local_40 = in_stack_00000008;
    local_44 = (btScalar)((int)in_R9D * (int)in_stack_00000008);
    lVar5 = (long)(int)local_44;
    local_3c = in_R9D;
    local_50 = (btSoftBody *)btVector3::operator_new__(0x2936ac);
    if (lVar5 != 0) {
      in_stack_ffffffffffffff20 =
           (btSoftBody *)
           ((local_50->super_btCollisionObject).m_worldTransform.m_basis.m_el[lVar5 + -1].m_floats +
           2);
      local_d8 = local_50;
      do {
        btVector3::btVector3((btVector3 *)local_d8);
        pbVar9 = (btSoftBody *)
                 ((local_d8->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2)
        ;
        in_stack_ffffffffffffff18 = local_d8;
        local_d8 = pbVar9;
      } while (pbVar9 != in_stack_ffffffffffffff20);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)local_44;
    uVar6 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    local_68 = operator_new__(uVar6);
    for (local_6c = 0; local_6c < (int)local_40; local_6c = local_6c + 1) {
      local_70 = (float)local_6c / (float)((int)local_40 + -1);
      in_stack_ffffffffffffff10 = (btSoftBody *)&local_70;
      lerp(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(btScalar *)0x2937a8);
      lerp(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(btScalar *)0x2937d4);
      for (local_94 = 0; local_94 < (int)local_3c; local_94 = local_94 + 1) {
        bVar8 = lerp(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(btScalar *)0x293830);
        pbVar4 = (local_50->super_btCollisionObject).m_worldTransform.m_basis.m_el
                 [(long)(local_6c * (int)local_3c + local_94) + -1].m_floats;
        local_a8 = bVar8.m_floats._0_8_;
        *(undefined8 *)(pbVar4 + 2) = local_a8;
        local_a0 = bVar8.m_floats._8_8_;
        *(undefined8 *)(pbVar4 + 4) = local_a0;
        *(undefined4 *)((long)local_68 + (long)(local_6c * (int)local_3c + local_94) * 4) =
             0x3f800000;
      }
    }
    pbVar7 = (btSoftBody *)btCollisionObject::operator_new(0x2938f2);
    btSoftBody::btSoftBody(in_stack_00000100,worldInfo,corner00._4_4_,corner10,corner01->m_floats);
    pbVar9 = pbVar7;
    if ((in_stack_00000010 & 1) != 0) {
      btSoftBody::setMass(in_stack_ffffffffffffff10,(int)((ulong)pbVar7 >> 0x20),SUB84(pbVar7,0));
    }
    if ((in_stack_00000010 & 2) != 0) {
      btSoftBody::setMass(in_stack_ffffffffffffff10,(int)((ulong)pbVar9 >> 0x20),SUB84(pbVar9,0));
    }
    if ((in_stack_00000010 & 4) != 0) {
      btSoftBody::setMass(in_stack_ffffffffffffff10,(int)((ulong)pbVar9 >> 0x20),SUB84(pbVar9,0));
    }
    if ((in_stack_00000010 & 8) != 0) {
      btSoftBody::setMass(in_stack_ffffffffffffff10,(int)((ulong)pbVar9 >> 0x20),SUB84(pbVar9,0));
    }
    if (local_50 != (btSoftBody *)0x0) {
      btVector3::operator_delete__((void *)0x293a31);
    }
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
    for (local_6c = 0; local_8 = pbVar7, local_6c < (int)local_40; local_6c = local_6c + 1) {
      for (local_b4 = 0; local_b4 < (int)local_3c; local_b4 = local_b4 + 1) {
        bVar1 = local_b4 + 1 < (int)local_3c;
        bVar2 = local_6c + 1 < (int)local_40;
        if (bVar1) {
          btSoftBody::appendLink
                    (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18,(Material *)in_stack_ffffffffffffff10,
                     SUB81((ulong)pbVar9 >> 0x38,0));
        }
        if (bVar2) {
          btSoftBody::appendLink
                    (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (int)in_stack_ffffffffffffff18,(Material *)in_stack_ffffffffffffff10,
                     SUB81((ulong)pbVar9 >> 0x38,0));
        }
        if ((bVar1) && (bVar2)) {
          node2 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
          node0 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          if ((local_b4 + local_6c & 1U) == 0) {
            btSoftBody::appendFace
                      (in_stack_ffffffffffffff20,node0,(int)in_stack_ffffffffffffff18,node2,
                       (Material *)pbVar9);
            btSoftBody::appendFace
                      (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18,
                       (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(Material *)pbVar9);
            if ((local_35 & 1) != 0) {
              btSoftBody::appendLink
                        (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                         (int)in_stack_ffffffffffffff18,(Material *)in_stack_ffffffffffffff10,
                         SUB81((ulong)pbVar9 >> 0x38,0));
            }
          }
          else {
            btSoftBody::appendFace
                      (in_stack_ffffffffffffff20,node0,(int)in_stack_ffffffffffffff18,node2,
                       (Material *)pbVar9);
            btSoftBody::appendFace
                      (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (int)in_stack_ffffffffffffff18,
                       (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(Material *)pbVar9);
            if ((local_35 & 1) != 0) {
              btSoftBody::appendLink
                        (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                         (int)in_stack_ffffffffffffff18,(Material *)in_stack_ffffffffffffff10,
                         SUB81((ulong)pbVar9 >> 0x38,0));
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreatePatch(btSoftBodyWorldInfo& worldInfo,const btVector3& corner00,
											   const btVector3& corner10,
											   const btVector3& corner01,
											   const btVector3& corner11,
											   int resx,
											   int resy,
											   int fixeds,
											   bool gendiags)
{
#define IDX(_x_,_y_)	((_y_)*rx+(_x_))
	/* Create nodes	*/ 
	if((resx<2)||(resy<2)) return(0);
	const int	rx=resx;
	const int	ry=resy;
	const int	tot=rx*ry;
	btVector3*	x=new btVector3[tot];
	btScalar*	m=new btScalar[tot];
	int iy;

	for(iy=0;iy<ry;++iy)
	{
		const btScalar	ty=iy/(btScalar)(ry-1);
		const btVector3	py0=lerp(corner00,corner01,ty);
		const btVector3	py1=lerp(corner10,corner11,ty);
		for(int ix=0;ix<rx;++ix)
		{
			const btScalar	tx=ix/(btScalar)(rx-1);
			x[IDX(ix,iy)]=lerp(py0,py1,tx);
			m[IDX(ix,iy)]=1;
		}
	}
	btSoftBody*		psb=new btSoftBody(&worldInfo,tot,x,m);
	if(fixeds&1)	psb->setMass(IDX(0,0),0);
	if(fixeds&2)	psb->setMass(IDX(rx-1,0),0);
	if(fixeds&4)	psb->setMass(IDX(0,ry-1),0);
	if(fixeds&8)	psb->setMass(IDX(rx-1,ry-1),0);
	delete[] x;
	delete[] m;
	/* Create links	and faces */ 
	for(iy=0;iy<ry;++iy)
	{
		for(int ix=0;ix<rx;++ix)
		{
			const int	idx=IDX(ix,iy);
			const bool	mdx=(ix+1)<rx;
			const bool	mdy=(iy+1)<ry;
			if(mdx) psb->appendLink(idx,IDX(ix+1,iy));
			if(mdy) psb->appendLink(idx,IDX(ix,iy+1));
			if(mdx&&mdy)
			{
				if((ix+iy)&1)
				{
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy),IDX(ix+1,iy+1));
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy+1),IDX(ix,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix,iy),IDX(ix+1,iy+1));
					}
				}
				else
				{
					psb->appendFace(IDX(ix,iy+1),IDX(ix,iy),IDX(ix+1,iy));
					psb->appendFace(IDX(ix,iy+1),IDX(ix+1,iy),IDX(ix+1,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix+1,iy),IDX(ix,iy+1));
					}
				}
			}
		}
	}
	/* Finished		*/ 
#undef IDX
	return(psb);
}